

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

DSA * d2i_DSA_PUBKEY(DSA **a,uchar **pp,long length)

{
  dsa_st *pdVar1;
  pointer __p;
  UniquePtr<DSA> dsa;
  UniquePtr<EVP_PKEY> pkey;
  CBS cbs;
  _Head_base<0UL,_dsa_st_*,_false> local_38;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_30;
  CBS local_28;
  
  if (length < 0) {
    pdVar1 = (dsa_st *)0x0;
  }
  else {
    local_28.data = *pp;
    local_28.len = length;
    local_30._M_head_impl = EVP_parse_public_key(&local_28);
    if ((EVP_PKEY *)local_30._M_head_impl == (EVP_PKEY *)0x0) {
      pdVar1 = (dsa_st *)0x0;
    }
    else {
      pdVar1 = EVP_PKEY_get1_DSA((EVP_PKEY *)local_30._M_head_impl);
      local_38._M_head_impl = (dsa_st *)pdVar1;
      if (pdVar1 != (dsa_st *)0x0) {
        if (a != (DSA **)0x0) {
          DSA_free(*a);
          *a = pdVar1;
        }
        *pp = local_28.data;
        local_38._M_head_impl = (dsa_st *)0x0;
      }
      std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<dsa_st,_bssl::internal::Deleter> *)&local_38);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_30);
  }
  return pdVar1;
}

Assistant:

DSA *d2i_DSA_PUBKEY(DSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<DSA> dsa(EVP_PKEY_get1_DSA(pkey.get()));
  if (dsa == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    DSA_free(*out);
    *out = dsa.get();
  }
  *inp = CBS_data(&cbs);
  return dsa.release();
}